

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pDrawCallBatchingTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Performance::DrawCallBatchingTests::init(DrawCallBatchingTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  long *name;
  long **name_00;
  int iVar2;
  int iVar3;
  uint uVar4;
  deUint32 seed;
  long *plVar5;
  TestNode *pTVar6;
  TestNode *node;
  TestNode *node_00;
  ostream *poVar7;
  long **pplVar8;
  long *plVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  char *pcVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  long *local_2f0 [2];
  long local_2e0 [2];
  long *local_2d0;
  long local_2c8;
  long local_2c0;
  long lStack_2b8;
  int local_2b0;
  int local_2ac;
  long *local_2a8;
  long local_2a0;
  long local_298;
  long lStack_290;
  long *local_288;
  long local_280;
  long local_278;
  long lStack_270;
  TestNode *local_268;
  TestNode *local_260;
  TestNode *local_258;
  char *local_250;
  ulong local_248;
  ulong local_240;
  long local_238;
  ulong local_230;
  ulong local_228;
  long local_220;
  char *local_218;
  ulong local_210;
  TestNode *local_208;
  TestNode *local_200;
  long local_1f8;
  long local_1f0;
  char *local_1e8;
  long local_1e0;
  char *local_1d8;
  Context *local_1d0;
  long *local_1c8 [2];
  long local_1b8 [2];
  long **local_1a8;
  long *local_1a0;
  long *local_198;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  ios_base local_138 [264];
  
  uVar12 = 0;
  local_260 = (TestNode *)this;
  do {
    bVar17 = (int)uVar12 == 1;
    local_250 = "draw_arrays";
    if (bVar17) {
      local_250 = "draw_elements";
    }
    local_210 = 0;
    do {
      iVar11 = (int)uVar12;
      iVar14 = (int)local_210;
      if (iVar14 != 1 || iVar11 == 1) {
        local_218 = "";
        if (iVar14 == 1) {
          local_218 = "buffer_";
        }
        local_248 = 0;
        do {
          iVar2 = (int)local_248;
          if (iVar2 != 1 || iVar14 == 1 && iVar11 == 1) {
            pcVar13 = "";
            if (iVar2 == 1) {
              pcVar13 = "dynamic_";
            }
            local_240 = uVar12;
            local_268 = (TestNode *)operator_new(0x78);
            pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
            local_2f0[0] = local_2e0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2f0,pcVar13,pcVar13 + (ulong)(iVar2 == 1) * 8);
            plVar5 = (long *)std::__cxx11::string::append((char *)local_2f0);
            plVar9 = plVar5 + 2;
            if ((long *)*plVar5 == plVar9) {
              local_2c0 = *plVar9;
              lStack_2b8 = plVar5[3];
              local_2d0 = &local_2c0;
            }
            else {
              local_2c0 = *plVar9;
              local_2d0 = (long *)*plVar5;
            }
            local_2c8 = plVar5[1];
            *plVar5 = (long)plVar9;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_2d0);
            pplVar8 = (long **)(plVar5 + 2);
            if ((long **)*plVar5 == pplVar8) {
              local_198 = *pplVar8;
              uStack_190 = (undefined4)plVar5[3];
              uStack_18c = *(undefined4 *)((long)plVar5 + 0x1c);
              local_1a8 = &local_198;
            }
            else {
              local_198 = *pplVar8;
              local_1a8 = (long **)*plVar5;
            }
            name_00 = local_1a8;
            local_1a0 = (long *)plVar5[1];
            *plVar5 = (long)pplVar8;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            local_288 = &local_278;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_288,"Test batched rendering with ","");
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_288);
            pTVar6 = local_268;
            local_2a8 = &local_298;
            plVar9 = plVar5 + 2;
            if ((long *)*plVar5 == plVar9) {
              local_298 = *plVar9;
              lStack_290 = plVar5[3];
            }
            else {
              local_298 = *plVar9;
              local_2a8 = (long *)*plVar5;
            }
            local_2a0 = plVar5[1];
            *plVar5 = (long)plVar9;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            tcu::TestCaseGroup::TestCaseGroup
                      ((TestCaseGroup *)local_268,pCVar1->m_testCtx,(char *)name_00,
                       (char *)local_2a8);
            pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00781de0;
            pTVar6[1]._vptr_TestNode = (_func_int **)pCVar1;
            if (local_2a8 != &local_298) {
              operator_delete(local_2a8,local_298 + 1);
            }
            this = (DrawCallBatchingTests *)local_260;
            if (local_288 != &local_278) {
              operator_delete(local_288,local_278 + 1);
            }
            if (local_1a8 != &local_198) {
              operator_delete(local_1a8,(long)local_198 + 1);
            }
            if (local_2d0 != &local_2c0) {
              operator_delete(local_2d0,local_2c0 + 1);
            }
            if (local_2f0[0] != local_2e0) {
              operator_delete(local_2f0[0],local_2e0[0] + 1);
            }
            tcu::TestNode::addChild((TestNode *)this,pTVar6);
            lVar15 = 0;
            do {
              iVar3 = (&DAT_00672a08)[lVar15];
              local_220 = lVar15;
              pTVar6 = (TestNode *)operator_new(0x78);
              pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
              local_2b0 = iVar3;
              std::ostream::operator<<((ostringstream *)&local_1a8,iVar3);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
              std::ios_base::~ios_base(local_138);
              plVar5 = (long *)std::__cxx11::string::append((char *)local_2f0);
              plVar9 = plVar5 + 2;
              if ((long *)*plVar5 == plVar9) {
                local_2c0 = *plVar9;
                lStack_2b8 = plVar5[3];
                local_2d0 = &local_2c0;
              }
              else {
                local_2c0 = *plVar9;
                local_2d0 = (long *)*plVar5;
              }
              name = local_2d0;
              local_2c8 = plVar5[1];
              *plVar5 = (long)plVar9;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
              std::ostream::operator<<((ostringstream *)&local_1a8,local_2b0);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
              std::ios_base::~ios_base(local_138);
              plVar5 = (long *)std::__cxx11::string::replace
                                         ((ulong)local_1c8,0,(char *)0x0,0x672b4a);
              plVar9 = plVar5 + 2;
              if ((long *)*plVar5 == plVar9) {
                local_278 = *plVar9;
                lStack_270 = plVar5[3];
                local_288 = &local_278;
              }
              else {
                local_278 = *plVar9;
                local_288 = (long *)*plVar5;
              }
              local_280 = plVar5[1];
              *plVar5 = (long)plVar9;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_288);
              plVar9 = plVar5 + 2;
              if ((long *)*plVar5 == plVar9) {
                local_298 = *plVar9;
                lStack_290 = plVar5[3];
                local_2a8 = &local_298;
              }
              else {
                local_298 = *plVar9;
                local_2a8 = (long *)*plVar5;
              }
              local_2a0 = plVar5[1];
              *plVar5 = (long)plVar9;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)pTVar6,pCVar1->m_testCtx,(char *)name,(char *)local_2a8);
              pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00781de0;
              pTVar6[1]._vptr_TestNode = (_func_int **)pCVar1;
              if (local_2a8 != &local_298) {
                operator_delete(local_2a8,local_298 + 1);
              }
              this = (DrawCallBatchingTests *)local_260;
              if (local_288 != &local_278) {
                operator_delete(local_288,local_278 + 1);
              }
              if (local_1c8[0] != local_1b8) {
                operator_delete(local_1c8[0],local_1b8[0] + 1);
              }
              if (local_2d0 != &local_2c0) {
                operator_delete(local_2d0,local_2c0 + 1);
              }
              if (local_2f0[0] != local_2e0) {
                operator_delete(local_2f0[0],local_2e0[0] + 1);
              }
              node = (TestNode *)operator_new(0x78);
              pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)node,pCVar1->m_testCtx,"1_attribute",
                         "Test draw call batching with 1 attribute.");
              node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00781de0;
              node[1]._vptr_TestNode = (_func_int **)pCVar1;
              node_00 = (TestNode *)operator_new(0x78);
              pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)node_00,pCVar1->m_testCtx,"8_attributes",
                         "Test draw call batching with 8 attributes.");
              node_00->_vptr_TestNode = (_func_int **)&PTR__TestCase_00781de0;
              node_00[1]._vptr_TestNode = (_func_int **)pCVar1;
              tcu::TestNode::addChild(pTVar6,node);
              tcu::TestNode::addChild(pTVar6,node_00);
              tcu::TestNode::addChild(local_268,pTVar6);
              lVar15 = 0;
              uVar12 = local_240;
              local_208 = node_00;
              local_200 = node;
              do {
                local_228 = (ulong)(uint)(&DAT_00672a40)[lVar15];
                local_230 = (ulong)(uint)(&DAT_00672a60)[lVar15];
                iVar3 = (&DAT_00672a60)[lVar15] + (&DAT_00672a40)[lVar15];
                local_258 = local_200;
                if ((iVar3 != 1) && (local_258 = local_208, iVar3 != 8)) {
                  local_258 = (TestNode *)0x0;
                }
                bVar18 = lVar15 == 4;
                bVar19 = lVar15 == 1;
                local_1d8 = "buffers_";
                local_1e8 = "buffers_";
                if (bVar19) {
                  local_1e8 = "buffer_";
                }
                bVar20 = lVar15 == 3;
                bVar21 = lVar15 == 0;
                if (bVar21) {
                  local_1d8 = "buffer_";
                }
                local_1e0 = 8 - (ulong)bVar21;
                local_1f0 = 8 - (ulong)bVar19;
                lVar10 = 0;
                local_238 = lVar15;
                do {
                  local_2ac = (&DAT_00672a10)[lVar10];
                  uVar4 = 0;
                  local_1f8 = lVar10;
                  do {
                    uVar16 = 0;
                    do {
                      if (((bVar18 || bVar19) & (byte)uVar16) == 0 &&
                          ((bVar20 || bVar21) & (byte)uVar4) == 0) {
                        pTVar6 = (TestNode *)operator_new(0x1d8);
                        pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
                        iVar3 = (int)lVar15;
                        if ((iVar3 != 1) && (iVar3 != 4)) {
                          poVar7 = (ostream *)
                                   std::ostream::operator<<
                                             ((ostringstream *)&local_1a8,(int)local_228);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_static_",8);
                        }
                        if ((uVar16 & 1) != 0) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_1a8,local_1d8,local_1e0);
                        }
                        if ((iVar3 != 0) && (iVar3 != 3)) {
                          poVar7 = (ostream *)
                                   std::ostream::operator<<
                                             ((ostringstream *)&local_1a8,(int)local_230);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_dynamic_",9);
                        }
                        if ((uVar4 & 1) != 0) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_1a8,local_1e8,local_1f0);
                        }
                        poVar7 = (ostream *)
                                 std::ostream::operator<<((ostringstream *)&local_1a8,local_2ac);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_triangles",10);
                        std::__cxx11::stringbuf::str();
                        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
                        std::ios_base::~ios_base(local_138);
                        plVar9 = local_2d0;
                        local_1a8 = &local_198;
                        local_2f0[0] = (long *)0x44;
                        pplVar8 = (long **)std::__cxx11::string::_M_create
                                                     ((ulong *)&local_1a8,(ulong)local_2f0);
                        plVar5 = local_2f0[0];
                        local_198 = local_2f0[0];
                        local_1d0 = pCVar1;
                        local_1a8 = pplVar8;
                        memcpy(pplVar8,
                               "Test performance of batched rendering against non-batched rendering."
                               ,0x44);
                        pCVar1 = local_1d0;
                        local_1a0 = plVar5;
                        *(undefined1 *)((long)pplVar8 + (long)plVar5) = 0;
                        tcu::TestCase::TestCase
                                  ((TestCase *)pTVar6,local_1d0->m_testCtx,NODETYPE_PERFORMANCE,
                                   (char *)plVar9,(char *)local_1a8);
                        pTVar6->_vptr_TestNode = (_func_int **)&PTR__DrawCallBatchingTest_007988c0;
                        *(undefined4 *)&pTVar6[1]._vptr_TestNode = 0;
                        pTVar6[1].m_testCtx = (TestContext *)pCVar1->m_renderCtx;
                        seed = deStringHash((char *)plVar9);
                        deRandom_init((deRandom *)&pTVar6[1].m_name,seed);
                        pTVar6[1].m_name.field_2._M_allocated_capacity = 0x2200000000;
                        *(undefined4 *)((long)&pTVar6[1].m_name.field_2 + 8) = 0x22;
                        pTVar6[1].m_name.field_2._M_local_buf[0xc] = (byte)uVar16;
                        *(int *)&pTVar6[1].m_description._M_dataplus._M_p = (int)local_228;
                        *(byte *)((long)&pTVar6[1].m_description._M_dataplus._M_p + 4) = (byte)uVar4
                        ;
                        *(int *)&pTVar6[1].m_description._M_string_length = (int)local_230;
                        *(int *)((long)&pTVar6[1].m_description._M_string_length + 4) = local_2ac;
                        *(int *)&pTVar6[1].m_description.field_2 = local_2b0;
                        pTVar6[1].m_description.field_2._M_local_buf[4] = bVar17;
                        pTVar6[1].m_description.field_2._M_local_buf[5] = iVar14 == 1;
                        pTVar6[1].m_description.field_2._M_local_buf[6] = iVar2 == 1;
                        *(undefined8 *)((long)&pTVar6[1].m_description.field_2 + 8) = 0;
                        *(undefined8 *)&pTVar6[1].m_nodeType = 0;
                        pTVar6[1].m_children.
                        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                        pTVar6[1].m_children.
                        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                        pTVar6[1].m_children.
                        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                        pTVar6[2]._vptr_TestNode = (_func_int **)0x0;
                        pTVar6[2].m_testCtx = (TestContext *)0x0;
                        pTVar6[2].m_name._M_dataplus._M_p = (pointer)0x0;
                        pTVar6[2].m_name._M_string_length = 0;
                        pTVar6[2].m_name.field_2._M_allocated_capacity = 0;
                        *(undefined8 *)((long)&pTVar6[2].m_name.field_2 + 4) = 0;
                        *(undefined8 *)((long)&pTVar6[2].m_name.field_2 + 0xc) = 0;
                        memset(&pTVar6[2].m_description._M_string_length,0,0xc0);
                        tcu::TestNode::addChild(local_258,pTVar6);
                        this = (DrawCallBatchingTests *)local_260;
                        if (local_1a8 != &local_198) {
                          operator_delete(local_1a8,(long)local_198 + 1);
                        }
                        lVar15 = local_238;
                        uVar12 = local_240;
                        if (local_2d0 != &local_2c0) {
                          operator_delete(local_2d0,local_2c0 + 1);
                        }
                      }
                      uVar16 = uVar16 + 1;
                    } while (uVar16 == 1);
                    bVar22 = uVar4 == 0;
                    uVar4 = uVar4 + 1;
                  } while (bVar22);
                  lVar10 = local_1f8 + 1;
                } while (local_1f8 == 0);
                lVar15 = lVar15 + 1;
              } while (lVar15 != 5);
              lVar15 = local_220 + 1;
            } while (local_220 == 0);
          }
          iVar2 = (int)local_248;
          local_248 = (ulong)(iVar2 + 1);
        } while (iVar2 == 0);
      }
      iVar11 = (int)local_210;
      local_210 = (ulong)(iVar11 + 1);
    } while (iVar11 == 0);
    iVar11 = (int)uVar12;
    uVar12 = (ulong)(iVar11 + 1);
  } while (iVar11 == 0);
  return 0x648f75;
}

Assistant:

void DrawCallBatchingTests::init (void)
{
	int drawCallCounts[] = {
		10, 100
	};

	int triangleCounts[] = {
		2, 10
	};

	int staticAttributeCounts[] = {
		1, 0, 4, 8, 0
	};

	int dynamicAttributeCounts[] = {
		0, 1, 4, 0, 8
	};

	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(staticAttributeCounts) == DE_LENGTH_OF_ARRAY(dynamicAttributeCounts));

	for (int drawType = 0; drawType < 2; drawType++)
	{
		bool drawElements = (drawType == 1);

		for (int indexBufferNdx = 0; indexBufferNdx < 2; indexBufferNdx++)
		{
			bool useIndexBuffer = (indexBufferNdx == 1);

			if (useIndexBuffer && !drawElements)
				continue;

			for (int dynamicIndexNdx = 0; dynamicIndexNdx < 2; dynamicIndexNdx++)
			{
				bool dynamicIndices = (dynamicIndexNdx == 1);

				if (dynamicIndices && !drawElements)
					continue;

				if (dynamicIndices && !useIndexBuffer)
					continue;

				TestCaseGroup* drawTypeGroup = new TestCaseGroup(m_context, (string(dynamicIndices ? "dynamic_" : "") + (useIndexBuffer ? "buffer_" : "" ) + (drawElements ? "draw_elements" : "draw_arrays")).c_str(), (string("Test batched rendering with ") + (drawElements ? "draw_elements" : "draw_arrays")).c_str());

				addChild(drawTypeGroup);

				for (int drawCallCountNdx = 0; drawCallCountNdx < DE_LENGTH_OF_ARRAY(drawCallCounts); drawCallCountNdx++)
				{
					int drawCallCount = drawCallCounts[drawCallCountNdx];

					TestCaseGroup*	callCountGroup			= new TestCaseGroup(m_context, (de::toString(drawCallCount) + (drawCallCount == 1 ? "_draw" : "_draws")).c_str(), ("Test batched rendering performance with " + de::toString(drawCallCount) + " draw calls.").c_str());
					TestCaseGroup*	attributeCount1Group	= new TestCaseGroup(m_context, "1_attribute", "Test draw call batching with 1 attribute.");
					TestCaseGroup*	attributeCount8Group	= new TestCaseGroup(m_context, "8_attributes", "Test draw call batching with 8 attributes.");

					callCountGroup->addChild(attributeCount1Group);
					callCountGroup->addChild(attributeCount8Group);

					drawTypeGroup->addChild(callCountGroup);

					for (int attributeCountNdx = 0; attributeCountNdx < DE_LENGTH_OF_ARRAY(dynamicAttributeCounts); attributeCountNdx++)
					{
						TestCaseGroup*	attributeCountGroup		= NULL;

						int				staticAttributeCount	= staticAttributeCounts[attributeCountNdx];
						int				dynamicAttributeCount	= dynamicAttributeCounts[attributeCountNdx];

						if (staticAttributeCount + dynamicAttributeCount == 1)
							attributeCountGroup = attributeCount1Group;
						else if (staticAttributeCount + dynamicAttributeCount == 8)
							attributeCountGroup = attributeCount8Group;
						else
							DE_ASSERT(false);

						for (int triangleCountNdx = 0; triangleCountNdx < DE_LENGTH_OF_ARRAY(triangleCounts); triangleCountNdx++)
						{
							int triangleCount = triangleCounts[triangleCountNdx];

							for (int dynamicBufferNdx = 0; dynamicBufferNdx < 2; dynamicBufferNdx++)
							{
								bool useDynamicBuffer = (dynamicBufferNdx != 0);

								for (int staticBufferNdx = 0; staticBufferNdx < 2; staticBufferNdx++)
								{
									bool useStaticBuffer = (staticBufferNdx != 0);

									DrawCallBatchingTest::TestSpec spec;

									spec.useStaticBuffer		= useStaticBuffer;
									spec.staticAttributeCount	= staticAttributeCount;

									spec.useDynamicBuffer		= useDynamicBuffer;
									spec.dynamicAttributeCount	= dynamicAttributeCount;

									spec.drawCallCount			= drawCallCount;
									spec.triangleCount			= triangleCount;

									spec.useDrawElements		= drawElements;
									spec.useIndexBuffer			= useIndexBuffer;
									spec.dynamicIndices			= dynamicIndices;

									if (spec.useStaticBuffer && spec.staticAttributeCount == 0)
										continue;

									if (spec.useDynamicBuffer && spec.dynamicAttributeCount == 0)
										continue;

									attributeCountGroup->addChild(new DrawCallBatchingTest(m_context, specToName(spec).c_str(), specToDescrpition(spec).c_str(), spec));
								}
							}
						}
					}
				}
			}
		}
	}
}